

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools.h
# Opt level: O3

chain * __thiscall
hashset<hashtableentry<char_*,_int>_>::insert(hashset<hashtableentry<char_*,_int>_> *this,uint h)

{
  chain **ppcVar1;
  undefined1 auVar2 [16];
  chainchunk *pcVar3;
  long lVar4;
  undefined1 auVar5 [16];
  long lVar6;
  
  pcVar3 = (chainchunk *)this->unused;
  if (pcVar3 == (chainchunk *)0x0) {
    pcVar3 = (chainchunk *)operator_new(0x608);
    pcVar3->next = this->chunks;
    this->chunks = pcVar3;
    auVar2 = _DAT_00166120;
    lVar4 = 0x28;
    auVar5 = _DAT_00166110;
    do {
      lVar6 = auVar5._8_8_;
      if (SUB164(auVar5 ^ auVar2,4) == -0x80000000 && SUB164(auVar5 ^ auVar2,0) < -0x7fffffc1) {
        *(chain **)((long)(pcVar3->chains + -1) + lVar4) = pcVar3->chains + auVar5._0_8_ + 1;
        *(chain **)((long)&pcVar3->chains[0].elem.key + lVar4) = pcVar3->chains + lVar6 + 1;
      }
      auVar5._0_8_ = auVar5._0_8_ + 2;
      auVar5._8_8_ = lVar6 + 2;
      lVar4 = lVar4 + 0x30;
    } while (lVar4 != 0x628);
    pcVar3->chains[0x3f].next = (chain *)0x0;
  }
  this->unused = pcVar3->chains[0].next;
  ppcVar1 = this->chains;
  pcVar3->chains[0].next = ppcVar1[h];
  ppcVar1[h] = pcVar3->chains;
  this->numelems = this->numelems + 1;
  return pcVar3->chains;
}

Assistant:

chain *insert(uint h)
    {
        if(!unused)
        {
            chainchunk *chunk = new chainchunk;
            chunk->next = chunks;
            chunks = chunk;
            loopi(CHUNKSIZE-1) chunk->chains[i].next = &chunk->chains[i+1];
            chunk->chains[CHUNKSIZE-1].next = unused;
            unused = chunk->chains;
        }
        chain *c = unused;
        unused = unused->next;
        c->next = chains[h];
        chains[h] = c;
        numelems++;
        return c;
    }